

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O1

void __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::checkMsgLength
          (ManyToOneRingBuffer *this,index_t length)

{
  SourcedException *this_00;
  long *plVar1;
  char *pcVar2;
  size_type *psVar3;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (length <= this->m_maxMsgLength) {
    return;
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_88,this->m_maxMsgLength);
  std::operator+(&local_68,"encoded message exceeds maxMsgLength of ",&local_88);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_108._M_dataplus._M_p = (pointer)*plVar1;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_108._M_dataplus._M_p == psVar3) {
    local_108.field_2._M_allocated_capacity = *psVar3;
    local_108.field_2._8_8_ = plVar1[3];
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar3;
  }
  local_108._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_a8,length);
  std::operator+(&local_48,&local_108,&local_a8);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "void aeron::concurrent::ringbuffer::ManyToOneRingBuffer::checkMsgLength(util::index_t) const"
             ,"");
  pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/ringbuffer/ManyToOneRingBuffer.h"
                            );
  std::__cxx11::string::string((string *)&local_c8,pcVar2,&local_109);
  util::SourcedException::SourcedException(this_00,&local_48,&local_e8,&local_c8,0x139);
  *(undefined ***)this_00 = &PTR__SourcedException_00162440;
  __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

inline void checkMsgLength(util::index_t length) const
    {
        if (length > m_maxMsgLength)
        {
            throw util::IllegalArgumentException(
                "encoded message exceeds maxMsgLength of " + std::to_string(m_maxMsgLength) +
                " length=" + std::to_string(length),
                SOURCEINFO);
        }
    }